

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_uwsgi_module.c
# Opt level: O2

char * ngx_http_uwsgi_store(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  byte bVar1;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  ngx_int_t nVar5;
  ngx_http_script_compile_t local_80;
  
  bVar1 = *(byte *)((long)conf + 0x1a0);
  if ((~bVar1 & 0xc) != 0) {
    return "is duplicate";
  }
  pvVar2 = cf->args->elts;
  iVar4 = strcmp(*(char **)((long)pvVar2 + 0x18),"off");
  if (iVar4 == 0) {
    *(byte *)((long)conf + 0x1a0) = bVar1 & 0xf3;
  }
  else {
    if ('\0' < (char)(bVar1 << 6)) {
      return "is incompatible with \"uwsgi_cache\"";
    }
    *(byte *)((long)conf + 0x1a0) = bVar1 & 0xf7;
    pcVar3 = *(char **)((long)pvVar2 + 0x18);
    if (((*pcVar3 != 'o') || (pcVar3[1] != 'n')) || (pcVar3[2] != '\0')) {
      local_80.source = (ngx_str_t *)((long)pvVar2 + 0x10);
      (local_80.source)->len = (local_80.source)->len + 1;
      local_80.flushes = (ngx_array_t **)0x0;
      local_80.variables = 0;
      local_80._80_8_ = 0;
      local_80.size = 0;
      local_80.main = (void *)0x0;
      local_80.ncaptures = 0;
      local_80.captures_mask = 0;
      local_80.lengths = (ngx_array_t **)((long)conf + 400);
      local_80.values = (ngx_array_t **)((long)conf + 0x198);
      local_80.cf = cf;
      local_80.variables = ngx_http_script_variables_count(local_80.source);
      local_80._80_1_ = 6;
      nVar5 = ngx_http_script_compile(&local_80);
      return (char *)-(ulong)(nVar5 != 0);
    }
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_uwsgi_store(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_uwsgi_loc_conf_t *uwcf = conf;

    ngx_str_t                  *value;
    ngx_http_script_compile_t   sc;

    if (uwcf->upstream.store != NGX_CONF_UNSET) {
        return "is duplicate";
    }

    value = cf->args->elts;

    if (ngx_strcmp(value[1].data, "off") == 0) {
        uwcf->upstream.store = 0;
        return NGX_CONF_OK;
    }

#if (NGX_HTTP_CACHE)

    if (uwcf->upstream.cache > 0) {
        return "is incompatible with \"uwsgi_cache\"";
    }

#endif

    uwcf->upstream.store = 1;

    if (ngx_strcmp(value[1].data, "on") == 0) {
        return NGX_CONF_OK;
    }

    /* include the terminating '\0' into script */
    value[1].len++;

    ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

    sc.cf = cf;
    sc.source = &value[1];
    sc.lengths = &uwcf->upstream.store_lengths;
    sc.values = &uwcf->upstream.store_values;
    sc.variables = ngx_http_script_variables_count(&value[1]);
    sc.complete_lengths = 1;
    sc.complete_values = 1;

    if (ngx_http_script_compile(&sc) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}